

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16781328,_false,_embree::avx::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar12;
  byte bVar13;
  BVH *bvh;
  size_t sVar14;
  void *pvVar15;
  long lVar16;
  undefined1 auVar17 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  vbool<4> vVar29;
  char cVar30;
  uint uVar31;
  uint uVar32;
  int iVar33;
  size_t mask;
  ulong uVar34;
  ulong uVar35;
  undefined4 uVar36;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar37;
  NodeRef root;
  NodeRef *pNVar38;
  bool bVar39;
  float fVar40;
  vint4 ai;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar49;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  float fVar48;
  undefined1 in_ZMM0 [64];
  float fVar50;
  float fVar51;
  float fVar57;
  float fVar59;
  vint4 bi_11;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar61;
  undefined1 auVar54 [16];
  float fVar58;
  float fVar60;
  float fVar62;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar63;
  float fVar70;
  float fVar71;
  vint4 ai_2;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar72;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  vint4 bi_3;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  vint4 bi;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  vint4 bi_1;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar91;
  float fVar97;
  vint4 bi_2;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  vint4 ai_11;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  vfloat4 a0;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar109;
  float fVar113;
  float fVar114;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar115;
  float fVar116;
  float fVar119;
  float fVar120;
  vint4 ai_1;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar121;
  float fVar122;
  float fVar124;
  float fVar125;
  vint4 ai_3;
  undefined1 auVar123 [16];
  float fVar126;
  float fVar127;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar128 [64];
  undefined1 auVar132 [64];
  undefined1 local_1938 [8];
  float fStack_1930;
  float fStack_192c;
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_false> tray;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  auVar17 = mm_lookupmask_ps._0_16_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar69 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar46 = vpcmpeqd_avx(auVar69,(undefined1  [16])valid_i->field_0);
    auVar69 = *(undefined1 (*) [16])(ray + 0x80);
    auVar53 = ZEXT816(0) << 0x40;
    auVar56 = vcmpps_avx(auVar69,auVar53,5);
    auVar56 = vandps_avx(auVar56,auVar46);
    uVar31 = vmovmskps_avx(auVar56);
    if (uVar31 != 0) {
      uVar34 = (ulong)(uVar31 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar87._0_4_ =
           tray.dir.field_0._0_4_ * tray.dir.field_0._0_4_ +
           tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_ +
           tray.dir.field_0._16_4_ * tray.dir.field_0._16_4_;
      auVar87._4_4_ =
           tray.dir.field_0._4_4_ * tray.dir.field_0._4_4_ +
           tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_ +
           tray.dir.field_0._20_4_ * tray.dir.field_0._20_4_;
      auVar87._8_4_ =
           tray.dir.field_0._8_4_ * tray.dir.field_0._8_4_ +
           tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_ +
           tray.dir.field_0._24_4_ * tray.dir.field_0._24_4_;
      auVar87._12_4_ =
           tray.dir.field_0._12_4_ * tray.dir.field_0._12_4_ +
           tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_ +
           tray.dir.field_0._28_4_ * tray.dir.field_0._28_4_;
      auVar46 = vrsqrtps_avx(auVar87);
      fVar91 = auVar46._0_4_;
      fVar97 = auVar46._4_4_;
      fVar50 = auVar46._8_4_;
      fVar57 = auVar46._12_4_;
      pre.depth_scale.field_0.v[0] = fVar91 * 1.5 + fVar91 * fVar91 * fVar91 * auVar87._0_4_ * -0.5;
      pre.depth_scale.field_0.v[1] = fVar97 * 1.5 + fVar97 * fVar97 * fVar97 * auVar87._4_4_ * -0.5;
      pre.depth_scale.field_0.v[2] = fVar50 * 1.5 + fVar50 * fVar50 * fVar50 * auVar87._8_4_ * -0.5;
      pre.depth_scale.field_0.v[3] = fVar57 * 1.5 + fVar57 * fVar57 * fVar57 * auVar87._12_4_ * -0.5
      ;
      auVar46._8_4_ = 0x80000000;
      auVar46._0_8_ = 0x8000000080000000;
      auVar46._12_4_ = 0x80000000;
      do {
        lVar16 = 0;
        if (uVar34 != 0) {
          for (; (uVar34 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
          }
        }
        auVar87 = vinsertps_avx(ZEXT416(*(uint *)(ray + lVar16 * 4 + 0x40)),
                                ZEXT416(*(uint *)(ray + lVar16 * 4 + 0x50)),0x1c);
        auVar87 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(ray + lVar16 * 4 + 0x60)),0x28);
        fVar91 = *(float *)((long)pre.ray_space + lVar16 * 4 + -0x10);
        auVar104._0_4_ = auVar87._0_4_ * fVar91;
        auVar104._4_4_ = auVar87._4_4_ * fVar91;
        auVar104._8_4_ = auVar87._8_4_ * fVar91;
        auVar104._12_4_ = auVar87._12_4_ * fVar91;
        auVar101 = vshufpd_avx(auVar104,auVar104,1);
        auVar87 = vmovshdup_avx(auVar104);
        auVar110._0_4_ = auVar87._0_4_ ^ 0x80000000;
        auVar87 = vunpckhps_avx(auVar104,auVar53);
        auVar110._4_12_ = ZEXT812(0) << 0x20;
        auVar107 = vshufps_avx(auVar87,auVar110,0x41);
        auVar106._0_8_ = auVar101._0_8_ ^ 0x8000000080000000;
        auVar106._8_8_ = auVar101._8_8_ ^ auVar46._8_8_;
        auVar106 = vinsertps_avx(auVar106,auVar104,0x2a);
        auVar87 = vdpps_avx(auVar107,auVar107,0x7f);
        auVar101 = vdpps_avx(auVar106,auVar106,0x7f);
        auVar87 = vcmpps_avx(auVar101,auVar87,1);
        auVar87 = vshufps_avx(auVar87,auVar87,0);
        auVar87 = vblendvps_avx(auVar106,auVar107,auVar87);
        auVar101 = vdpps_avx(auVar87,auVar87,0x7f);
        auVar106 = vrsqrtss_avx(auVar101,auVar101);
        fVar97 = auVar106._0_4_;
        auVar101 = ZEXT416((uint)(fVar97 * 1.5 - auVar101._0_4_ * 0.5 * fVar97 * fVar97 * fVar97));
        auVar101 = vshufps_avx(auVar101,auVar101,0);
        auVar107._0_4_ = auVar87._0_4_ * auVar101._0_4_;
        auVar107._4_4_ = auVar87._4_4_ * auVar101._4_4_;
        auVar107._8_4_ = auVar87._8_4_ * auVar101._8_4_;
        auVar107._12_4_ = auVar87._12_4_ * auVar101._12_4_;
        auVar87 = vshufps_avx(auVar107,auVar107,0xc9);
        auVar101 = vshufps_avx(auVar104,auVar104,0xc9);
        auVar117._0_4_ = auVar101._0_4_ * auVar107._0_4_;
        auVar117._4_4_ = auVar101._4_4_ * auVar107._4_4_;
        auVar117._8_4_ = auVar101._8_4_ * auVar107._8_4_;
        auVar117._12_4_ = auVar101._12_4_ * auVar107._12_4_;
        auVar111._0_4_ = auVar104._0_4_ * auVar87._0_4_;
        auVar111._4_4_ = auVar104._4_4_ * auVar87._4_4_;
        auVar111._8_4_ = auVar104._8_4_ * auVar87._8_4_;
        auVar111._12_4_ = auVar104._12_4_ * auVar87._12_4_;
        auVar87 = vsubps_avx(auVar111,auVar117);
        auVar106 = vshufps_avx(auVar87,auVar87,0xc9);
        auVar87 = vdpps_avx(auVar106,auVar106,0x7f);
        auVar101 = vrsqrtss_avx(auVar87,auVar87);
        fVar97 = auVar101._0_4_;
        auVar87 = ZEXT416((uint)(fVar97 * 1.5 - auVar87._0_4_ * 0.5 * fVar97 * fVar97 * fVar97));
        auVar87 = vshufps_avx(auVar87,auVar87,0);
        auVar112._0_4_ = auVar87._0_4_ * auVar106._0_4_;
        auVar112._4_4_ = auVar87._4_4_ * auVar106._4_4_;
        auVar112._8_4_ = auVar87._8_4_ * auVar106._8_4_;
        auVar112._12_4_ = auVar87._12_4_ * auVar106._12_4_;
        auVar101._0_4_ = fVar91 * auVar104._0_4_;
        auVar101._4_4_ = fVar91 * auVar104._4_4_;
        auVar101._8_4_ = fVar91 * auVar104._8_4_;
        auVar101._12_4_ = fVar91 * auVar104._12_4_;
        auVar106 = vunpcklps_avx(auVar107,auVar101);
        auVar87 = vunpckhps_avx(auVar107,auVar101);
        auVar107 = vunpcklps_avx(auVar112,auVar53);
        auVar101 = vunpckhps_avx(auVar112,auVar53);
        aVar19 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar87,auVar101);
        aVar20 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar106,auVar107);
        aVar18 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar106,auVar107);
        pre.ray_space[lVar16].vx.field_0 = aVar20;
        pre.ray_space[lVar16].vy.field_0 = aVar18;
        pre.ray_space[lVar16].vz.field_0 = aVar19;
        uVar34 = uVar34 & uVar34 - 1;
      } while (uVar34 != 0);
      auVar102._8_4_ = 0x7fffffff;
      auVar102._0_8_ = 0x7fffffff7fffffff;
      auVar102._12_4_ = 0x7fffffff;
      auVar105._8_4_ = 0x219392ef;
      auVar105._0_8_ = 0x219392ef219392ef;
      auVar105._12_4_ = 0x219392ef;
      auVar46 = vandps_avx(auVar102,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar46 = vcmpps_avx(auVar46,auVar105,1);
      auVar46 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar105,auVar46)
      ;
      auVar108._8_4_ = 0x3f800000;
      auVar108._0_8_ = &DAT_3f8000003f800000;
      auVar108._12_4_ = 0x3f800000;
      auVar53 = vrcpps_avx(auVar46);
      fVar91 = auVar53._0_4_;
      auVar81._0_4_ = auVar46._0_4_ * fVar91;
      fVar97 = auVar53._4_4_;
      auVar81._4_4_ = auVar46._4_4_ * fVar97;
      fVar50 = auVar53._8_4_;
      auVar81._8_4_ = auVar46._8_4_ * fVar50;
      fVar57 = auVar53._12_4_;
      auVar81._12_4_ = auVar46._12_4_ * fVar57;
      auVar46 = vsubps_avx(auVar108,auVar81);
      tray.rdir.field_0._16_4_ = fVar91 + fVar91 * auVar46._0_4_;
      tray.rdir.field_0._20_4_ = fVar97 + fVar97 * auVar46._4_4_;
      tray.rdir.field_0._24_4_ = fVar50 + fVar50 * auVar46._8_4_;
      tray.rdir.field_0._28_4_ = fVar57 + fVar57 * auVar46._12_4_;
      auVar101 = ZEXT816(0) << 0x20;
      auVar46 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar101,5);
      auVar92._8_4_ = 0x20;
      auVar92._0_8_ = 0x2000000020;
      auVar92._12_4_ = 0x20;
      auVar98._8_4_ = 0x30;
      auVar98._0_8_ = 0x3000000030;
      auVar98._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar98,auVar92,auVar46);
      tray.org.field_0._0_4_ = (undefined4)*(undefined8 *)ray;
      tray.org.field_0._4_4_ = (undefined4)((ulong)*(undefined8 *)ray >> 0x20);
      tray.org.field_0._8_4_ = (undefined4)*(undefined8 *)(ray + 8);
      tray.org.field_0._12_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 8) >> 0x20);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x20);
      auVar46 = vandps_avx(auVar102,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar46 = vcmpps_avx(auVar46,auVar105,1);
      auVar53 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar105,auVar46)
      ;
      auVar46 = vandps_avx(auVar102,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar46 = vcmpps_avx(auVar46,auVar105,1);
      auVar46 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar105,auVar46)
      ;
      auVar87 = vrcpps_avx(auVar53);
      fVar91 = auVar87._0_4_;
      auVar64._0_4_ = auVar53._0_4_ * fVar91;
      fVar97 = auVar87._4_4_;
      auVar64._4_4_ = auVar53._4_4_ * fVar97;
      fVar50 = auVar87._8_4_;
      auVar64._8_4_ = auVar53._8_4_ * fVar50;
      fVar57 = auVar87._12_4_;
      auVar64._12_4_ = auVar53._12_4_ * fVar57;
      auVar53 = vsubps_avx(auVar108,auVar64);
      tray.rdir.field_0._0_4_ = fVar91 + fVar91 * auVar53._0_4_;
      tray.rdir.field_0._4_4_ = fVar97 + fVar97 * auVar53._4_4_;
      tray.rdir.field_0._8_4_ = fVar50 + fVar50 * auVar53._8_4_;
      tray.rdir.field_0._12_4_ = fVar57 + fVar57 * auVar53._12_4_;
      auVar53 = vrcpps_avx(auVar46);
      fVar91 = auVar53._0_4_;
      auVar52._0_4_ = auVar46._0_4_ * fVar91;
      fVar97 = auVar53._4_4_;
      auVar52._4_4_ = auVar46._4_4_ * fVar97;
      fVar50 = auVar53._8_4_;
      auVar52._8_4_ = auVar46._8_4_ * fVar50;
      fVar57 = auVar53._12_4_;
      auVar52._12_4_ = auVar46._12_4_ * fVar57;
      auVar46 = vsubps_avx(auVar108,auVar52);
      tray.rdir.field_0._32_4_ = fVar91 + fVar91 * auVar46._0_4_;
      tray.rdir.field_0._36_4_ = fVar97 + fVar97 * auVar46._4_4_;
      tray.rdir.field_0._40_4_ = fVar50 + fVar50 * auVar46._8_4_;
      tray.rdir.field_0._44_4_ = fVar57 + fVar57 * auVar46._12_4_;
      auVar46 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar101,1);
      auVar73._8_4_ = 0x10;
      auVar73._0_8_ = 0x1000000010;
      auVar73._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar46,auVar73);
      auVar46 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar101,5);
      auVar65._8_4_ = 0x40;
      auVar65._0_8_ = 0x4000000040;
      auVar65._12_4_ = 0x40;
      auVar74._8_4_ = 0x50;
      auVar74._0_8_ = 0x5000000050;
      auVar74._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar74,auVar65,auVar46);
      auVar46 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar101);
      auVar69 = vmaxps_avx(auVar69,auVar101);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar128 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar46,auVar56);
      auVar53._8_4_ = 0xff800000;
      auVar53._0_8_ = 0xff800000ff800000;
      auVar53._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar53,auVar69,auVar56);
      auVar69 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])tray.tfar.field_0
                            );
      terminated.field_0._0_4_ = auVar56._0_4_ ^ auVar69._0_4_;
      terminated.field_0._4_4_ = auVar56._4_4_ ^ auVar69._4_4_;
      terminated.field_0._8_4_ = auVar56._8_4_ ^ auVar69._8_4_;
      terminated.field_0._12_4_ = auVar56._12_4_ ^ auVar69._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar31 = 3;
      }
      else {
        uVar31 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar38 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar37 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      do {
        paVar37 = &((vfloat<4> *)paVar37)[-1].field_0;
        root.ptr = pNVar38[-1].ptr;
        pNVar38 = pNVar38 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_0032ceb2:
          iVar33 = 3;
        }
        else {
          aVar12 = *paVar37;
          auVar69 = vcmpps_avx((undefined1  [16])aVar12,(undefined1  [16])tray.tfar.field_0,1);
          uVar32 = vmovmskps_avx(auVar69);
          if (uVar32 == 0) {
            iVar33 = 2;
          }
          else {
            uVar34 = (ulong)(uVar32 & 0xff);
            uVar32 = POPCOUNT(uVar32 & 0xff);
            iVar33 = 0;
            if (uVar32 <= uVar31) {
              do {
                sVar14 = 0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> sVar14 & 1) == 0; sVar14 = sVar14 + 1) {
                  }
                }
                bVar39 = occluded1(This,bvh,root,sVar14,&pre,ray,&tray,context);
                if (bVar39) {
                  terminated.field_0.i[sVar14] = -1;
                }
                uVar34 = uVar34 & uVar34 - 1;
              } while (uVar34 != 0);
              auVar69 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
              iVar33 = 3;
              auVar128 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar69[0xf] < '\0') {
                auVar69._8_4_ = 0xff800000;
                auVar69._0_8_ = 0xff800000ff800000;
                auVar69._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar69,
                                   (undefined1  [16])terminated.field_0);
                iVar33 = 2;
              }
            }
            vVar29.field_0 = terminated.field_0;
            auVar132 = ZEXT1664((undefined1  [16])aVar12);
            if (uVar31 < uVar32) {
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr != 0xfffffffffffffff8) {
                    auVar69 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar132._0_16_,6);
                    if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar69 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar69 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar69[0xf]) {
                      iVar33 = 2;
                    }
                    else {
                      bVar13 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                      pvVar15 = This->leafIntersector;
                      local_17f8 = auVar17._0_8_;
                      uStack_17f0 = auVar17._8_8_;
                      valid_o.field_0._0_8_ = local_17f8;
                      valid_o.field_0._8_8_ = uStack_17f0;
                      uVar32 = vmovmskps_avx((undefined1  [16])terminated.field_0);
                      if ((uVar32 ^ 0xf) != 0) {
                        uVar34 = (ulong)(byte)(uVar32 ^ 0xf);
                        do {
                          lVar16 = 0;
                          if (uVar34 != 0) {
                            for (; (uVar34 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                            }
                          }
                          cVar30 = (**(code **)((long)pvVar15 + (ulong)bVar13 * 0x40 + 0x18))
                                             (&pre,ray,lVar16,context,
                                              (byte *)(root.ptr & 0xfffffffffffffff0));
                          if (cVar30 != '\0') {
                            valid_o.field_0.i[lVar16] = -1;
                          }
                          uVar34 = uVar34 & uVar34 - 1;
                        } while (uVar34 != 0);
                      }
                      auVar23._8_8_ = valid_o.field_0._8_8_;
                      auVar23._0_8_ = valid_o.field_0._0_8_;
                      terminated.field_0 =
                           (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                           vorps_avx((undefined1  [16])vVar29.field_0,auVar23);
                      auVar69 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
                      if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar69 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar69 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar69[0xf]) {
                        iVar33 = 3;
                      }
                      else {
                        auVar68._8_4_ = 0xff800000;
                        auVar68._0_8_ = 0xff800000ff800000;
                        auVar68._12_4_ = 0xff800000;
                        tray.tfar.field_0 =
                             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                             vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar68,
                                           (undefined1  [16])terminated.field_0);
                        iVar33 = 0;
                      }
                    }
                    auVar128 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                 ));
                    break;
                  }
                  goto LAB_0032ceb2;
                }
                uVar35 = root.ptr & 0xfffffffffffffff0;
                uVar32 = (uint)root.ptr & 7;
                auVar69 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar132._0_16_,6);
                auVar132 = ZEXT1664(auVar128._0_16_);
                uVar34 = 0;
                root.ptr = 8;
                do {
                  sVar14 = *(size_t *)(uVar35 + uVar34 * 8);
                  if (sVar14 != 8) {
                    if ((uVar32 == 6) || (uVar32 == 1)) {
                      fVar91 = *(float *)(uVar35 + 0x80 + uVar34 * 4);
                      fVar97 = *(float *)(uVar35 + 0x20 + uVar34 * 4);
                      auVar46 = *(undefined1 (*) [16])(ray + 0x70);
                      fVar50 = auVar46._0_4_;
                      fVar57 = auVar46._4_4_;
                      fVar59 = auVar46._8_4_;
                      fVar61 = auVar46._12_4_;
                      auVar41._0_4_ = fVar50 * fVar91 + fVar97;
                      auVar41._4_4_ = fVar57 * fVar91 + fVar97;
                      auVar41._8_4_ = fVar59 * fVar91 + fVar97;
                      auVar41._12_4_ = fVar61 * fVar91 + fVar97;
                      fVar91 = *(float *)(uVar35 + 0xa0 + uVar34 * 4);
                      fVar97 = *(float *)(uVar35 + 0x40 + uVar34 * 4);
                      auVar66._0_4_ = fVar50 * fVar91 + fVar97;
                      auVar66._4_4_ = fVar57 * fVar91 + fVar97;
                      auVar66._8_4_ = fVar59 * fVar91 + fVar97;
                      auVar66._12_4_ = fVar61 * fVar91 + fVar97;
                      fVar91 = *(float *)(uVar35 + 0xc0 + uVar34 * 4);
                      fVar97 = *(float *)(uVar35 + 0x60 + uVar34 * 4);
                      auVar75._0_4_ = fVar50 * fVar91 + fVar97;
                      auVar75._4_4_ = fVar57 * fVar91 + fVar97;
                      auVar75._8_4_ = fVar59 * fVar91 + fVar97;
                      auVar75._12_4_ = fVar61 * fVar91 + fVar97;
                      fVar91 = *(float *)(uVar35 + 0x90 + uVar34 * 4);
                      fVar97 = *(float *)(uVar35 + 0x30 + uVar34 * 4);
                      auVar82._0_4_ = fVar50 * fVar91 + fVar97;
                      auVar82._4_4_ = fVar57 * fVar91 + fVar97;
                      auVar82._8_4_ = fVar59 * fVar91 + fVar97;
                      auVar82._12_4_ = fVar61 * fVar91 + fVar97;
                      fVar91 = *(float *)(uVar35 + 0xb0 + uVar34 * 4);
                      fVar97 = *(float *)(uVar35 + 0x50 + uVar34 * 4);
                      auVar88._0_4_ = fVar50 * fVar91 + fVar97;
                      auVar88._4_4_ = fVar57 * fVar91 + fVar97;
                      auVar88._8_4_ = fVar59 * fVar91 + fVar97;
                      auVar88._12_4_ = fVar61 * fVar91 + fVar97;
                      fVar91 = *(float *)(uVar35 + 0xd0 + uVar34 * 4);
                      fVar97 = *(float *)(uVar35 + 0x70 + uVar34 * 4);
                      auVar93._0_4_ = fVar50 * fVar91 + fVar97;
                      auVar93._4_4_ = fVar57 * fVar91 + fVar97;
                      auVar93._8_4_ = fVar59 * fVar91 + fVar97;
                      auVar93._12_4_ = fVar61 * fVar91 + fVar97;
                      auVar24._4_4_ = tray.org.field_0._4_4_;
                      auVar24._0_4_ = tray.org.field_0._0_4_;
                      auVar24._8_4_ = tray.org.field_0._8_4_;
                      auVar24._12_4_ = tray.org.field_0._12_4_;
                      auVar25._8_8_ = tray.org.field_0._24_8_;
                      auVar25._0_8_ = tray.org.field_0._16_8_;
                      auVar53 = vsubps_avx(auVar41,auVar24);
                      auVar42._0_4_ = tray.rdir.field_0._0_4_ * auVar53._0_4_;
                      auVar42._4_4_ = tray.rdir.field_0._4_4_ * auVar53._4_4_;
                      auVar42._8_4_ = tray.rdir.field_0._8_4_ * auVar53._8_4_;
                      auVar42._12_4_ = tray.rdir.field_0._12_4_ * auVar53._12_4_;
                      auVar53 = vsubps_avx(auVar66,auVar25);
                      auVar118._0_4_ = tray.rdir.field_0._16_4_ * auVar53._0_4_;
                      auVar118._4_4_ = tray.rdir.field_0._20_4_ * auVar53._4_4_;
                      auVar118._8_4_ = tray.rdir.field_0._24_4_ * auVar53._8_4_;
                      auVar118._12_4_ = tray.rdir.field_0._28_4_ * auVar53._12_4_;
                      auVar53 = vsubps_avx(auVar75,(undefined1  [16])
                                                   tray.org.field_0.field_0.z.field_0);
                      auVar123._0_4_ = auVar53._0_4_ * (float)tray.rdir.field_0._32_4_;
                      auVar123._4_4_ = auVar53._4_4_ * (float)tray.rdir.field_0._36_4_;
                      auVar123._8_4_ = auVar53._8_4_ * (float)tray.rdir.field_0._40_4_;
                      auVar123._12_4_ = auVar53._12_4_ * (float)tray.rdir.field_0._44_4_;
                      auVar53 = vsubps_avx(auVar82,auVar24);
                      auVar83._0_4_ = tray.rdir.field_0._0_4_ * auVar53._0_4_;
                      auVar83._4_4_ = tray.rdir.field_0._4_4_ * auVar53._4_4_;
                      auVar83._8_4_ = tray.rdir.field_0._8_4_ * auVar53._8_4_;
                      auVar83._12_4_ = tray.rdir.field_0._12_4_ * auVar53._12_4_;
                      auVar53 = vsubps_avx(auVar88,auVar25);
                      auVar89._0_4_ = tray.rdir.field_0._16_4_ * auVar53._0_4_;
                      auVar89._4_4_ = tray.rdir.field_0._20_4_ * auVar53._4_4_;
                      auVar89._8_4_ = tray.rdir.field_0._24_4_ * auVar53._8_4_;
                      auVar89._12_4_ = tray.rdir.field_0._28_4_ * auVar53._12_4_;
                      auVar53 = vsubps_avx(auVar93,(undefined1  [16])
                                                   tray.org.field_0.field_0.z.field_0);
                      auVar76._0_4_ = auVar53._0_4_ * (float)tray.rdir.field_0._32_4_;
                      auVar76._4_4_ = auVar53._4_4_ * (float)tray.rdir.field_0._36_4_;
                      auVar76._8_4_ = auVar53._8_4_ * (float)tray.rdir.field_0._40_4_;
                      auVar76._12_4_ = auVar53._12_4_ * (float)tray.rdir.field_0._44_4_;
                      auVar53 = vpminsd_avx(auVar42,auVar83);
                      auVar87 = vpminsd_avx(auVar118,auVar89);
                      auVar53 = vpmaxsd_avx(auVar53,auVar87);
                      auVar87 = vpminsd_avx(auVar123,auVar76);
                      auVar87 = vpmaxsd_avx(auVar53,auVar87);
                      auVar53 = vpmaxsd_avx(auVar42,auVar83);
                      auVar101 = vpmaxsd_avx(auVar118,auVar89);
                      auVar106 = vpminsd_avx(auVar53,auVar101);
                      auVar53 = vpmaxsd_avx(auVar123,auVar76);
                      auVar101 = vpmaxsd_avx(auVar87,(undefined1  [16])tray.tnear.field_0);
                      auVar53 = vpminsd_avx(auVar106,auVar53);
                      auVar53 = vpminsd_avx(auVar53,(undefined1  [16])tray.tfar.field_0);
                      auVar53 = vcmpps_avx(auVar101,auVar53,2);
                      if (uVar32 == 6) {
                        uVar36 = *(undefined4 *)(uVar35 + 0xe0 + uVar34 * 4);
                        auVar77._4_4_ = uVar36;
                        auVar77._0_4_ = uVar36;
                        auVar77._8_4_ = uVar36;
                        auVar77._12_4_ = uVar36;
                        auVar101 = vcmpps_avx(auVar77,auVar46,2);
                        uVar36 = *(undefined4 *)(uVar35 + 0xf0 + uVar34 * 4);
                        auVar84._4_4_ = uVar36;
                        auVar84._0_4_ = uVar36;
                        auVar84._8_4_ = uVar36;
                        auVar84._12_4_ = uVar36;
                        auVar46 = vcmpps_avx(auVar46,auVar84,1);
                        auVar46 = vandps_avx(auVar101,auVar46);
                        auVar53 = vandps_avx(auVar46,auVar53);
                      }
                    }
                    else {
                      fVar91 = *(float *)(uVar35 + 0x50 + uVar34 * 4);
                      fVar97 = *(float *)(uVar35 + 0x60 + uVar34 * 4);
                      fVar50 = *(float *)(uVar35 + 0x70 + uVar34 * 4);
                      fVar57 = *(float *)(uVar35 + 0x80 + uVar34 * 4);
                      fVar59 = *(float *)(uVar35 + 0x90 + uVar34 * 4);
                      fVar61 = *(float *)(uVar35 + 0xe0 + uVar34 * 4);
                      fVar1 = *(float *)(uVar35 + 0xf0 + uVar34 * 4);
                      fVar2 = *(float *)(uVar35 + 0x100 + uVar34 * 4);
                      fVar3 = *(float *)(uVar35 + 0x110 + uVar34 * 4);
                      fVar4 = *(float *)(uVar35 + 0x120 + uVar34 * 4);
                      fVar5 = *(float *)(uVar35 + 0x130 + uVar34 * 4);
                      auVar46 = *(undefined1 (*) [16])(ray + 0x70);
                      auVar78._8_4_ = 0x3f800000;
                      auVar78._0_8_ = &DAT_3f8000003f800000;
                      auVar78._12_4_ = 0x3f800000;
                      auVar53 = vsubps_avx(auVar78,auVar46);
                      fVar116 = auVar46._0_4_;
                      fVar119 = auVar46._4_4_;
                      fVar120 = auVar46._8_4_;
                      fVar121 = auVar46._12_4_;
                      fVar122 = auVar53._0_4_;
                      fVar127 = fVar122 * 0.0;
                      fVar124 = auVar53._4_4_;
                      fVar129 = fVar124 * 0.0;
                      fVar125 = auVar53._8_4_;
                      fVar130 = fVar125 * 0.0;
                      fVar126 = auVar53._12_4_;
                      fVar131 = fVar126 * 0.0;
                      local_1938._4_4_ = fVar124 + fVar119 * fVar5;
                      local_1938._0_4_ = fVar122 + fVar116 * fVar5;
                      fStack_1930 = fVar125 + fVar120 * fVar5;
                      fStack_192c = fVar126 + fVar121 * fVar5;
                      fVar5 = *(float *)(uVar35 + 0xa0 + uVar34 * 4);
                      fVar6 = *(float *)(uVar35 + 0x20 + uVar34 * 4);
                      auVar67._0_4_ =
                           fVar6 * (float)tray.dir.field_0._0_4_ +
                           fVar91 * (float)tray.dir.field_0._16_4_ +
                           fVar57 * (float)tray.dir.field_0._32_4_;
                      auVar67._4_4_ =
                           fVar6 * (float)tray.dir.field_0._4_4_ +
                           fVar91 * (float)tray.dir.field_0._20_4_ +
                           fVar57 * (float)tray.dir.field_0._36_4_;
                      auVar67._8_4_ =
                           fVar6 * (float)tray.dir.field_0._8_4_ +
                           fVar91 * (float)tray.dir.field_0._24_4_ +
                           fVar57 * (float)tray.dir.field_0._40_4_;
                      auVar67._12_4_ =
                           fVar6 * (float)tray.dir.field_0._12_4_ +
                           fVar91 * (float)tray.dir.field_0._28_4_ +
                           fVar57 * (float)tray.dir.field_0._44_4_;
                      fVar7 = *(float *)(uVar35 + 0x30 + uVar34 * 4);
                      auVar94._0_4_ =
                           fVar97 * (float)tray.dir.field_0._16_4_ +
                           fVar59 * (float)tray.dir.field_0._32_4_ +
                           fVar7 * (float)tray.dir.field_0._0_4_;
                      auVar94._4_4_ =
                           fVar97 * (float)tray.dir.field_0._20_4_ +
                           fVar59 * (float)tray.dir.field_0._36_4_ +
                           fVar7 * (float)tray.dir.field_0._4_4_;
                      auVar94._8_4_ =
                           fVar97 * (float)tray.dir.field_0._24_4_ +
                           fVar59 * (float)tray.dir.field_0._40_4_ +
                           fVar7 * (float)tray.dir.field_0._8_4_;
                      auVar94._12_4_ =
                           fVar97 * (float)tray.dir.field_0._28_4_ +
                           fVar59 * (float)tray.dir.field_0._44_4_ +
                           fVar7 * (float)tray.dir.field_0._12_4_;
                      fVar8 = *(float *)(uVar35 + 0x40 + uVar34 * 4);
                      auVar43._0_4_ =
                           fVar8 * (float)tray.dir.field_0._0_4_ +
                           fVar50 * (float)tray.dir.field_0._16_4_ +
                           fVar5 * (float)tray.dir.field_0._32_4_;
                      auVar43._4_4_ =
                           fVar8 * (float)tray.dir.field_0._4_4_ +
                           fVar50 * (float)tray.dir.field_0._20_4_ +
                           fVar5 * (float)tray.dir.field_0._36_4_;
                      auVar43._8_4_ =
                           fVar8 * (float)tray.dir.field_0._8_4_ +
                           fVar50 * (float)tray.dir.field_0._24_4_ +
                           fVar5 * (float)tray.dir.field_0._40_4_;
                      auVar43._12_4_ =
                           fVar8 * (float)tray.dir.field_0._12_4_ +
                           fVar50 * (float)tray.dir.field_0._28_4_ +
                           fVar5 * (float)tray.dir.field_0._44_4_;
                      auVar99._8_4_ = 0x7fffffff;
                      auVar99._0_8_ = 0x7fffffff7fffffff;
                      auVar99._12_4_ = 0x7fffffff;
                      auVar46 = vandps_avx(auVar67,auVar99);
                      auVar103._8_4_ = 0x219392ef;
                      auVar103._0_8_ = 0x219392ef219392ef;
                      auVar103._12_4_ = 0x219392ef;
                      auVar46 = vcmpps_avx(auVar46,auVar103,1);
                      auVar53 = vblendvps_avx(auVar67,auVar103,auVar46);
                      auVar46 = vandps_avx(auVar94,auVar99);
                      auVar46 = vcmpps_avx(auVar46,auVar103,1);
                      auVar87 = vblendvps_avx(auVar94,auVar103,auVar46);
                      auVar46 = vandps_avx(auVar43,auVar99);
                      auVar46 = vcmpps_avx(auVar46,auVar103,1);
                      auVar46 = vblendvps_avx(auVar43,auVar103,auVar46);
                      auVar101 = vrcpps_avx(auVar53);
                      fVar63 = auVar101._0_4_;
                      auVar54._0_4_ = fVar63 * auVar53._0_4_;
                      fVar70 = auVar101._4_4_;
                      auVar54._4_4_ = fVar70 * auVar53._4_4_;
                      fVar71 = auVar101._8_4_;
                      auVar54._8_4_ = fVar71 * auVar53._8_4_;
                      fVar72 = auVar101._12_4_;
                      auVar54._12_4_ = fVar72 * auVar53._12_4_;
                      auVar53 = vsubps_avx(auVar78,auVar54);
                      fVar63 = fVar63 + fVar63 * auVar53._0_4_;
                      fVar70 = fVar70 + fVar70 * auVar53._4_4_;
                      fVar71 = fVar71 + fVar71 * auVar53._8_4_;
                      fVar72 = fVar72 + fVar72 * auVar53._12_4_;
                      auVar53 = vrcpps_avx(auVar87);
                      fVar51 = auVar53._0_4_;
                      auVar95._0_4_ = fVar51 * auVar87._0_4_;
                      fVar58 = auVar53._4_4_;
                      auVar95._4_4_ = fVar58 * auVar87._4_4_;
                      fVar60 = auVar53._8_4_;
                      auVar95._8_4_ = fVar60 * auVar87._8_4_;
                      fVar62 = auVar53._12_4_;
                      auVar95._12_4_ = fVar62 * auVar87._12_4_;
                      auVar53 = vsubps_avx(auVar78,auVar95);
                      fVar51 = fVar51 + fVar51 * auVar53._0_4_;
                      fVar58 = fVar58 + fVar58 * auVar53._4_4_;
                      fVar60 = fVar60 + fVar60 * auVar53._8_4_;
                      fVar62 = fVar62 + fVar62 * auVar53._12_4_;
                      auVar53 = vrcpps_avx(auVar46);
                      fVar40 = auVar53._0_4_;
                      auVar44._0_4_ = fVar40 * auVar46._0_4_;
                      fVar47 = auVar53._4_4_;
                      auVar44._4_4_ = fVar47 * auVar46._4_4_;
                      fVar48 = auVar53._8_4_;
                      auVar44._8_4_ = fVar48 * auVar46._8_4_;
                      fVar49 = auVar53._12_4_;
                      auVar44._12_4_ = fVar49 * auVar46._12_4_;
                      auVar46 = vsubps_avx(auVar78,auVar44);
                      fVar40 = fVar40 + fVar40 * auVar46._0_4_;
                      fVar47 = fVar47 + fVar47 * auVar46._4_4_;
                      fVar48 = fVar48 + fVar48 * auVar46._8_4_;
                      fVar49 = fVar49 + fVar49 * auVar46._12_4_;
                      fVar9 = *(float *)(uVar35 + 0xb0 + uVar34 * 4);
                      fVar10 = *(float *)(uVar35 + 0xc0 + uVar34 * 4);
                      auVar132 = ZEXT1664(auVar132._0_16_);
                      fVar11 = *(float *)(uVar35 + 0xd0 + uVar34 * 4);
                      fVar109 = (float)tray.org.field_0._16_8_;
                      fVar113 = (float)((ulong)tray.org.field_0._16_8_ >> 0x20);
                      fVar114 = (float)tray.org.field_0._24_8_;
                      fVar115 = (float)((ulong)tray.org.field_0._24_8_ >> 0x20);
                      auVar85._0_4_ =
                           fVar6 * (float)tray.org.field_0._0_4_ +
                           fVar109 * fVar91 + fVar57 * (float)tray.org.field_0._32_4_ + fVar9;
                      auVar85._4_4_ =
                           fVar6 * (float)tray.org.field_0._4_4_ +
                           fVar113 * fVar91 + fVar57 * (float)tray.org.field_0._36_4_ + fVar9;
                      auVar85._8_4_ =
                           fVar6 * (float)tray.org.field_0._8_4_ +
                           fVar114 * fVar91 + fVar57 * (float)tray.org.field_0._40_4_ + fVar9;
                      auVar85._12_4_ =
                           fVar6 * (float)tray.org.field_0._12_4_ +
                           fVar115 * fVar91 + fVar57 * (float)tray.org.field_0._44_4_ + fVar9;
                      auVar79._0_4_ =
                           fVar7 * (float)tray.org.field_0._0_4_ +
                           fVar10 + fVar59 * (float)tray.org.field_0._32_4_ + fVar97 * fVar109;
                      auVar79._4_4_ =
                           fVar7 * (float)tray.org.field_0._4_4_ +
                           fVar10 + fVar59 * (float)tray.org.field_0._36_4_ + fVar97 * fVar113;
                      auVar79._8_4_ =
                           fVar7 * (float)tray.org.field_0._8_4_ +
                           fVar10 + fVar59 * (float)tray.org.field_0._40_4_ + fVar97 * fVar114;
                      auVar79._12_4_ =
                           fVar7 * (float)tray.org.field_0._12_4_ +
                           fVar10 + fVar59 * (float)tray.org.field_0._44_4_ + fVar97 * fVar115;
                      auVar128 = ZEXT1664(CONCAT412(0x7f800000,
                                                    CONCAT48(0x7f800000,0x7f8000007f800000)));
                      auVar90._0_4_ =
                           fVar8 * (float)tray.org.field_0._0_4_ +
                           fVar109 * fVar50 + fVar11 + fVar5 * (float)tray.org.field_0._32_4_;
                      auVar90._4_4_ =
                           fVar8 * (float)tray.org.field_0._4_4_ +
                           fVar113 * fVar50 + fVar11 + fVar5 * (float)tray.org.field_0._36_4_;
                      auVar90._8_4_ =
                           fVar8 * (float)tray.org.field_0._8_4_ +
                           fVar114 * fVar50 + fVar11 + fVar5 * (float)tray.org.field_0._40_4_;
                      auVar90._12_4_ =
                           fVar8 * (float)tray.org.field_0._12_4_ +
                           fVar115 * fVar50 + fVar11 + fVar5 * (float)tray.org.field_0._44_4_;
                      auVar27._4_4_ = fVar129 + fVar119 * fVar61;
                      auVar27._0_4_ = fVar127 + fVar116 * fVar61;
                      auVar27._8_4_ = fVar130 + fVar120 * fVar61;
                      auVar27._12_4_ = fVar131 + fVar121 * fVar61;
                      auVar46 = vsubps_avx(auVar27,auVar85);
                      auVar26._4_4_ = fVar124 + fVar119 * fVar3;
                      auVar26._0_4_ = fVar122 + fVar116 * fVar3;
                      auVar26._8_4_ = fVar125 + fVar120 * fVar3;
                      auVar26._12_4_ = fVar126 + fVar121 * fVar3;
                      auVar53 = vsubps_avx(auVar26,auVar85);
                      auVar96._0_4_ = fVar63 * auVar46._0_4_;
                      auVar96._4_4_ = fVar70 * auVar46._4_4_;
                      auVar96._8_4_ = fVar71 * auVar46._8_4_;
                      auVar96._12_4_ = fVar72 * auVar46._12_4_;
                      auVar86._0_4_ = fVar63 * auVar53._0_4_;
                      auVar86._4_4_ = fVar70 * auVar53._4_4_;
                      auVar86._8_4_ = fVar71 * auVar53._8_4_;
                      auVar86._12_4_ = fVar72 * auVar53._12_4_;
                      auVar21._4_4_ = fVar129 + fVar119 * fVar1;
                      auVar21._0_4_ = fVar127 + fVar116 * fVar1;
                      auVar21._8_4_ = fVar130 + fVar120 * fVar1;
                      auVar21._12_4_ = fVar131 + fVar121 * fVar1;
                      auVar46 = vsubps_avx(auVar21,auVar79);
                      auVar28._4_4_ = fVar124 + fVar119 * fVar4;
                      auVar28._0_4_ = fVar122 + fVar116 * fVar4;
                      auVar28._8_4_ = fVar125 + fVar120 * fVar4;
                      auVar28._12_4_ = fVar126 + fVar121 * fVar4;
                      auVar53 = vsubps_avx(auVar28,auVar79);
                      auVar100._0_4_ = fVar51 * auVar46._0_4_;
                      auVar100._4_4_ = fVar58 * auVar46._4_4_;
                      auVar100._8_4_ = fVar60 * auVar46._8_4_;
                      auVar100._12_4_ = fVar62 * auVar46._12_4_;
                      auVar55._0_4_ = fVar51 * auVar53._0_4_;
                      auVar55._4_4_ = fVar58 * auVar53._4_4_;
                      auVar55._8_4_ = fVar60 * auVar53._8_4_;
                      auVar55._12_4_ = fVar62 * auVar53._12_4_;
                      auVar22._4_4_ = fVar129 + fVar119 * fVar2;
                      auVar22._0_4_ = fVar127 + fVar116 * fVar2;
                      auVar22._8_4_ = fVar130 + fVar120 * fVar2;
                      auVar22._12_4_ = fVar131 + fVar121 * fVar2;
                      auVar46 = vsubps_avx(auVar22,auVar90);
                      auVar80._0_4_ = fVar40 * auVar46._0_4_;
                      auVar80._4_4_ = fVar47 * auVar46._4_4_;
                      auVar80._8_4_ = fVar48 * auVar46._8_4_;
                      auVar80._12_4_ = fVar49 * auVar46._12_4_;
                      auVar46 = vsubps_avx(_local_1938,auVar90);
                      auVar45._0_4_ = fVar40 * auVar46._0_4_;
                      auVar45._4_4_ = fVar47 * auVar46._4_4_;
                      auVar45._8_4_ = fVar48 * auVar46._8_4_;
                      auVar45._12_4_ = fVar49 * auVar46._12_4_;
                      auVar46 = vpminsd_avx(auVar96,auVar86);
                      auVar53 = vpminsd_avx(auVar100,auVar55);
                      auVar46 = vpmaxsd_avx(auVar46,auVar53);
                      auVar53 = vpminsd_avx(auVar80,auVar45);
                      auVar87 = vpmaxsd_avx(auVar46,auVar53);
                      auVar46 = vpmaxsd_avx(auVar96,auVar86);
                      auVar53 = vpmaxsd_avx(auVar100,auVar55);
                      auVar101 = vpminsd_avx(auVar46,auVar53);
                      auVar46 = vpmaxsd_avx(auVar80,auVar45);
                      auVar53 = vpmaxsd_avx(auVar87,(undefined1  [16])tray.tnear.field_0);
                      auVar46 = vpminsd_avx(auVar101,auVar46);
                      auVar46 = vpminsd_avx(auVar46,(undefined1  [16])tray.tfar.field_0);
                      auVar53 = vcmpps_avx(auVar53,auVar46,2);
                    }
                    auVar46 = vandps_avx(auVar53,auVar69);
                    auVar46 = vpslld_avx(auVar46,0x1f);
                    if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar46[0xf] < '\0') {
                      auVar46 = vblendvps_avx(auVar128._0_16_,auVar87,auVar46);
                      if (root.ptr != 8) {
                        pNVar38->ptr = root.ptr;
                        pNVar38 = pNVar38 + 1;
                        *paVar37 = auVar132._0_16_;
                        paVar37 = paVar37 + 1;
                      }
                      auVar132 = ZEXT1664(auVar46);
                      root.ptr = sVar14;
                    }
                  }
                } while ((sVar14 != 8) && (bVar39 = uVar34 < 3, uVar34 = uVar34 + 1, bVar39));
                iVar33 = 0;
                if (root.ptr == 8) {
LAB_0032cd82:
                  bVar39 = false;
                  iVar33 = 4;
                }
                else {
                  auVar69 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                       (undefined1  [16])auVar132._0_16_,6);
                  uVar36 = vmovmskps_avx(auVar69);
                  bVar39 = true;
                  if ((uint)POPCOUNT(uVar36) <= uVar31) {
                    pNVar38->ptr = root.ptr;
                    pNVar38 = pNVar38 + 1;
                    *paVar37 = auVar132._0_16_;
                    paVar37 = paVar37 + 1;
                    goto LAB_0032cd82;
                  }
                }
              } while (bVar39);
            }
          }
        }
      } while (iVar33 != 3);
      auVar17 = vandps_avx(auVar56,(undefined1  [16])terminated.field_0);
      auVar56._8_4_ = 0xff800000;
      auVar56._0_8_ = 0xff800000ff800000;
      auVar56._12_4_ = 0xff800000;
      auVar17 = vmaskmovps_avx(auVar17,auVar56);
      *(undefined1 (*) [16])(ray + 0x80) = auVar17;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }